

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

xmlChar * xmlSchemaStrip(xmlChar *value)

{
  byte *pbVar1;
  long lVar2;
  byte *cur;
  xmlChar *pxVar3;
  long lVar4;
  xmlChar *start;
  byte *pbVar5;
  byte *pbVar6;
  
  if (value != (xmlChar *)0x0) {
    lVar2 = 0;
    lVar4 = 0;
    while (((ulong)value[lVar2] < 0x21 && ((0x100002600U >> ((ulong)value[lVar2] & 0x3f) & 1) != 0))
          ) {
      lVar4 = lVar4 + -1;
      lVar2 = lVar2 + 1;
    }
    cur = value + -lVar4;
    pbVar1 = value + (-1 - lVar4);
    do {
      pbVar5 = pbVar1;
      pbVar1 = pbVar5 + 1;
      pbVar6 = pbVar1;
    } while (pbVar5[1] != 0);
    for (; cur < pbVar5; pbVar5 = pbVar5 + -1) {
      if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) {
        pbVar6 = pbVar5 + 1;
        break;
      }
      pbVar6 = cur + 1;
    }
    if (pbVar1 != pbVar6 || lVar4 != 0) {
      pxVar3 = xmlStrndup(cur,(int)lVar4 + ((int)pbVar6 - (int)value));
      return pxVar3;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlSchemaStrip(const xmlChar *value) {
    const xmlChar *start = value, *end, *f;

    if (value == NULL) return(NULL);
    while ((*start != 0) && (IS_BLANK_CH(*start))) start++;
    end = start;
    while (*end != 0) end++;
    f = end;
    end--;
    while ((end > start) && (IS_BLANK_CH(*end))) end--;
    end++;
    if ((start == value) && (f == end)) return(NULL);
    return(xmlStrndup(start, end - start));
}